

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

void __thiscall CommandLineParser::fail(CommandLineParser *this,string *message)

{
  CommandLineParserException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (CommandLineParserException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,"while parsing option ",&this->m_option);
  std::operator+(&local_60,&local_80,",\n");
  std::operator+(&local_40,&local_60,message);
  CommandLineParserException::CommandLineParserException(this_00,&local_40);
  __cxa_throw(this_00,&CommandLineParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void 
CommandLineParser::fail( std::string message )
{
  throw CommandLineParserException( "while parsing option " + m_option+
            ",\n" + message );
}